

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O2

ion_status_t sl_update(ion_skiplist_t *skiplist,ion_key_t key,ion_value_t value)

{
  ion_key_size_t iVar1;
  int iVar2;
  char cVar3;
  sl_node *psVar4;
  ion_status_t iVar5;
  ulong uVar6;
  ulong local_38;
  
  local_38 = 0x100000000;
  iVar1 = (skiplist->super).record.key_size;
  iVar2 = (skiplist->super).record.value_size;
  psVar4 = sl_find_node(skiplist,key);
  if (psVar4->key != (ion_key_t)0x0) {
    cVar3 = (*(skiplist->super).compare)(psVar4->key,key,iVar1);
    if (cVar3 == '\0') {
      local_38 = 0;
      for (; psVar4 != (ion_sl_node_t *)0x0; psVar4 = *psVar4->next) {
        cVar3 = (*(skiplist->super).compare)(psVar4->key,key,(skiplist->super).record.key_size);
        if (cVar3 != '\0') break;
        memcpy(psVar4->value,value,(long)iVar2);
        local_38 = local_38 + 0x100000000;
      }
      uVar6 = 0;
      goto LAB_001051b9;
    }
  }
  iVar5 = sl_insert(skiplist,key,value);
  uVar6 = (ulong)iVar5 & 0xff;
LAB_001051b9:
  return (ion_status_t)(uVar6 | local_38);
}

Assistant:

ion_status_t
sl_update(
	ion_skiplist_t	*skiplist,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_status_t status;

	status = ION_STATUS_INITIALIZE;

	ion_key_size_t		key_size	= skiplist->super.record.key_size;
	ion_value_size_t	value_size	= skiplist->super.record.value_size;
	ion_sl_node_t		*cursor		= sl_find_node(skiplist, key);

	/* If the key doesn't exist in the skiplist... */
	if ((NULL == cursor->key) || (skiplist->super.compare(cursor->key, key, key_size) != 0)) {
		/* Insert it. */
		status.error	= sl_insert(skiplist, key, value).error;
		status.count	= 1;
		return status;
	}

	/* Otherwise, the key exists and now we have the node to update. */

	/* While the cursor still has the same key as the target key... */
	while (NULL != cursor && skiplist->super.compare(cursor->key, key, skiplist->super.record.key_size) == 0) {
		/* Update the value, and then move on to the next node. */
		memcpy(cursor->value, value, value_size);
		cursor = cursor->next[0];
		status.count++;
	}

	status.error = err_ok;
	return status;
}